

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_ptr_test.cpp
# Opt level: O2

void __thiscall unique_ptr_compare_ptr_Test::TestBody(unique_ptr_compare_ptr_Test *this)

{
  long lVar1;
  unique_ptr<Struct2> uVar2;
  unique_ptr<Struct2> uVar3;
  Struct2 *pSVar4;
  char *pcVar5;
  long in_FS_OFFSET;
  AssertHelper local_48;
  AssertHelper local_40;
  unique_ptr<Struct2> yPtr;
  AssertionResult gtest_ar;
  unique_ptr<Struct2> xPtr;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  xPtr.px = (Struct2 *)operator_new(4);
  (xPtr.px)->mVal = 0x7b;
  Struct2::_mNbInstances = Struct2::_mNbInstances + 1;
  yPtr.px._0_1_ = 1;
  testing::internal::CmpHelperEQ<bool,unique_ptr<Struct2>>
            ((internal *)&gtest_ar,"true","xPtr",(bool *)&yPtr,&xPtr);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&yPtr);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
               ,0xcb,pcVar5);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&yPtr);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&yPtr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  yPtr.px = (Struct2 *)0x0;
  local_40.data_ = (AssertHelperData *)xPtr.px;
  testing::internal::CmpHelperNE<void*,Struct2*>
            ((internal *)&gtest_ar,"(void*)__null","xPtr.get()",&yPtr.px,(Struct2 **)&local_40);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&yPtr);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
               ,0xcc,pcVar5);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&yPtr);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&yPtr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  yPtr.px._0_4_ = 0x7b;
  pSVar4 = unique_ptr<Struct2>::operator->(&xPtr);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"123","xPtr->mVal",(int *)&yPtr,&pSVar4->mVal);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&yPtr);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
               ,0xcd,pcVar5);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&yPtr);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&yPtr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  yPtr.px._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"1","Struct2::_mNbInstances",(int *)&yPtr,&Struct2::_mNbInstances
            );
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&yPtr);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
               ,0xce,pcVar5);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&yPtr);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&yPtr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  uVar3 = xPtr;
  yPtr.px = (Struct2 *)operator_new(4);
  Struct2::_mNbInstances = Struct2::_mNbInstances + 1;
  (yPtr.px)->mVal = 0xea;
  local_40.data_._0_1_ = 1;
  testing::internal::CmpHelperEQ<bool,unique_ptr<Struct2>>
            ((internal *)&gtest_ar,"true","xPtr",(bool *)&local_40,&xPtr);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
               ,0xd4,pcVar5);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_40.data_ = (AssertHelperData *)0x0;
  local_48.data_ = (AssertHelperData *)xPtr.px;
  testing::internal::CmpHelperNE<void*,Struct2*>
            ((internal *)&gtest_ar,"(void*)__null","xPtr.get()",&local_40.data_,
             (Struct2 **)&local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
               ,0xd5,pcVar5);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_40.data_._0_4_ = 0x7b;
  pSVar4 = unique_ptr<Struct2>::operator->(&xPtr);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"123","xPtr->mVal",(int *)&local_40,&pSVar4->mVal);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
               ,0xd6,pcVar5);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_40.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"2","Struct2::_mNbInstances",(int *)&local_40,
             &Struct2::_mNbInstances);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
               ,0xd7,pcVar5);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_40.data_._0_1_ = 1;
  testing::internal::CmpHelperEQ<bool,unique_ptr<Struct2>>
            ((internal *)&gtest_ar,"true","yPtr",(bool *)&local_40,&yPtr);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
               ,0xd9,pcVar5);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_40.data_ = (AssertHelperData *)0x0;
  local_48.data_ = (AssertHelperData *)yPtr.px;
  testing::internal::CmpHelperNE<void*,Struct2*>
            ((internal *)&gtest_ar,"(void*)__null","yPtr.get()",&local_40.data_,
             (Struct2 **)&local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
               ,0xda,pcVar5);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_40.data_._0_4_ = 0xea;
  pSVar4 = unique_ptr<Struct2>::operator->(&yPtr);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"234","yPtr->mVal",(int *)&local_40,&pSVar4->mVal);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
               ,0xdb,pcVar5);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  uVar2 = yPtr;
  testing::internal::CmpHelperNE<unique_ptr<Struct2>,unique_ptr<Struct2>>
            ((internal *)&gtest_ar,"xPtr","yPtr",&xPtr,&yPtr);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
               ,0xde,pcVar5);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  if (uVar3.px < uVar2.px) {
    testing::internal::CmpHelperLT<unique_ptr<Struct2>,unique_ptr<Struct2>>
              ((internal *)&gtest_ar,"xPtr","yPtr",&xPtr,&yPtr);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_40);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
                 ,0xe1,pcVar5);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_40);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    testing::internal::CmpHelperLE<unique_ptr<Struct2>,unique_ptr<Struct2>>
              ((internal *)&gtest_ar,"xPtr","yPtr",&xPtr,&yPtr);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_40);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
                 ,0xe2,pcVar5);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_40);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    testing::internal::CmpHelperGT<unique_ptr<Struct2>,unique_ptr<Struct2>>
              ((internal *)&gtest_ar,"yPtr","xPtr",&yPtr,&xPtr);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_40);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
                 ,0xe3,pcVar5);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_40);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    testing::internal::CmpHelperGE<unique_ptr<Struct2>,unique_ptr<Struct2>>
              ((internal *)&gtest_ar,"yPtr","xPtr",&yPtr,&xPtr);
    if (gtest_ar.success_ != false) goto LAB_00140a8c;
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
               ,0xe4,pcVar5);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
  }
  else {
    testing::internal::CmpHelperGT<unique_ptr<Struct2>,unique_ptr<Struct2>>
              ((internal *)&gtest_ar,"xPtr","yPtr",&xPtr,&yPtr);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_40);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
                 ,0xe8,pcVar5);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_40);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    testing::internal::CmpHelperGE<unique_ptr<Struct2>,unique_ptr<Struct2>>
              ((internal *)&gtest_ar,"xPtr","yPtr",&xPtr,&yPtr);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_40);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
                 ,0xe9,pcVar5);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_40);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    testing::internal::CmpHelperLT<unique_ptr<Struct2>,unique_ptr<Struct2>>
              ((internal *)&gtest_ar,"yPtr","xPtr",&yPtr,&xPtr);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_40);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
                 ,0xea,pcVar5);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_40);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    testing::internal::CmpHelperLE<unique_ptr<Struct2>,unique_ptr<Struct2>>
              ((internal *)&gtest_ar,"yPtr","xPtr",&yPtr,&xPtr);
    if (gtest_ar.success_ != false) goto LAB_00140a8c;
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/unique_ptr_test.cpp"
               ,0xeb,pcVar5);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_48);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_40);
LAB_00140a8c:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  unique_ptr<Struct2>::destroy(&yPtr);
  unique_ptr<Struct2>::destroy(&xPtr);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

TEST(unique_ptr, compare_ptr)
{
    // Create a unique_ptr
    unique_ptr<Struct2> xPtr(new Struct2(123));

    EXPECT_EQ(true, xPtr);
    EXPECT_NE((void*)NULL, xPtr.get());
    EXPECT_EQ(123,xPtr->mVal);
    EXPECT_EQ(1, Struct2::_mNbInstances);
    Struct2* pX = xPtr.get();

    // Create another unique_ptr
    unique_ptr<Struct2> yPtr(new Struct2(234));

    EXPECT_EQ(true, xPtr);
    EXPECT_NE((void*)NULL, xPtr.get());
    EXPECT_EQ(123,xPtr->mVal);
    EXPECT_EQ(2, Struct2::_mNbInstances);

    EXPECT_EQ(true, yPtr);
    EXPECT_NE((void*)NULL, yPtr.get());
    EXPECT_EQ(234, yPtr->mVal);
    Struct2* pY = yPtr.get();

    EXPECT_NE(xPtr, yPtr);
    if (pX < pY)
    {
        EXPECT_LT(xPtr, yPtr);
        EXPECT_LE(xPtr, yPtr);
        EXPECT_GT(yPtr, xPtr);
        EXPECT_GE(yPtr, xPtr);
    }
    else // (pX > pY)
    {
        EXPECT_GT(xPtr, yPtr);
        EXPECT_GE(xPtr, yPtr);
        EXPECT_LT(yPtr, xPtr);
        EXPECT_LE(yPtr, xPtr);
    }
}